

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::LayerToStage(Layer *layer,Stage *stage_out,string *warn,string *err)

{
  _Hash_node_base *p_Var1;
  optional<tinyusdz::Prim> pv;
  Stage stage;
  optional<tinyusdz::Prim> local_1d48;
  char local_19f0;
  Prim local_19e8;
  undefined1 local_1698 [5600];
  _Rb_tree_node_base local_b8;
  size_t local_98;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
  a_Stack_90 [8];
  _Rb_tree_node_base local_88;
  size_t local_68;
  undefined2 local_60;
  pointer local_58;
  pointer puStack_50;
  pointer local_48;
  unsigned_long local_40;
  bool local_38;
  
  if (stage_out == (Stage *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    local_1698._48_8_ = local_1698 + 0x20;
    local_1698._0_8_ = (pointer)0x0;
    local_1698._8_8_ = (pointer)0x0;
    local_1698._16_8_ = (pointer)0x0;
    local_1698._32_4_ = _S_red;
    local_1698._40_8_ = (_Base_ptr)0x0;
    local_1698._64_8_ = 0;
    local_1698._72_8_ = local_1698 + 0x58;
    local_1698._80_8_ = 0;
    local_1698[0x58] = '\0';
    local_1698._104_8_ = -1;
    local_1698._56_8_ = local_1698._48_8_;
    LayerMetas::LayerMetas((LayerMetas *)(local_1698 + 0x70));
    local_1698._5528_8_ = local_1698 + 0x15a8;
    local_1698._5536_8_ = 0;
    local_1698[0x15a8] = '\0';
    local_1698._5560_8_ = local_1698 + 0x15c8;
    local_1698._5568_8_ = 0;
    local_1698[0x15c8] = '\0';
    local_b8._M_left = &local_b8;
    local_b8._M_color = _S_red;
    local_b8._M_parent = (_Base_ptr)0x0;
    local_98 = 0;
    local_88._M_left = &local_88;
    local_88._M_color = _S_red;
    local_88._M_parent = (_Base_ptr)0x0;
    local_68 = 0;
    local_60._0_1_ = true;
    local_60._1_1_ = true;
    local_58 = (pointer)0x0;
    puStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    local_40 = 1;
    local_38 = true;
    local_b8._M_right = local_b8._M_left;
    local_88._M_right = local_88._M_left;
    LayerMetas::operator=((LayerMetas *)(local_1698 + 0x70),&layer->_metas);
    p_Var1 = (layer->_prim_specs)._M_h._M_before_begin._M_nxt;
    if (p_Var1 != (_Hash_node_base *)0x0) {
      do {
        detail::ReconstructPrimFromPrimSpec(&local_1d48,(PrimSpec *)(p_Var1 + 5),warn,err);
        local_19f0 = local_1d48.has_value_;
        if (local_1d48.has_value_ == true) {
          Prim::Prim(&local_19e8,(Prim *)&local_1d48.contained);
        }
        if (local_1d48.has_value_ == true) {
          Prim::~Prim((Prim *)&local_1d48.contained);
        }
        if (local_19f0 == '\x01') {
          Stage::add_root_prim((Stage *)local_1698,&local_19e8,true);
        }
        if (local_19f0 == '\x01') {
          Prim::~Prim(&local_19e8);
        }
        p_Var1 = p_Var1->_M_nxt;
      } while (p_Var1 != (_Hash_node_base *)0x0);
    }
    std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator=
              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)stage_out,
               (vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)local_1698);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stage_out->_root_node_nameSet,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1698 + 0x18));
    ::std::__cxx11::string::_M_assign((string *)&stage_out->name);
    stage_out->default_root_node = local_1698._104_8_;
    LayerMetas::operator=(&stage_out->stage_metas,(LayerMetas *)(local_1698 + 0x70));
    ::std::__cxx11::string::_M_assign((string *)&stage_out->_err);
    ::std::__cxx11::string::_M_assign((string *)&stage_out->_warn);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                 *)&stage_out->_prim_path_cache,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                 *)(local_1698 + 0x15d8));
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
    ::operator=((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
                 *)&stage_out->_prim_id_cache,a_Stack_90);
    stage_out->_dirty = local_60._0_1_;
    stage_out->_prim_id_dirty = local_60._1_1_;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stage_out->_prim_id_allocator,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58);
    (stage_out->_prim_id_allocator).counter_ = local_40;
    (stage_out->_prim_id_allocator).dirty_ = local_38;
    Stage::~Stage((Stage *)local_1698);
  }
  return stage_out != (Stage *)0x0;
}

Assistant:

bool LayerToStage(const Layer &layer, Stage *stage_out, std::string *warn,
                  std::string *err) {
  if (!stage_out) {
    if (err) {
      (*err) += "`stage_ptr` is nullptr.";
    }
    return false;
  }

  Stage stage;

  stage.metas() = layer.metas();

  // TODO: primChildren metadatum
  for (const auto &primspec : layer.primspecs()) {
    if (auto pv =
            detail::ReconstructPrimFromPrimSpec(primspec.second, warn, err)) {
      stage.add_root_prim(std::move(pv.value()));
    }
  }

  (*stage_out) = stage;

  return true;
}